

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

int __thiscall
KMaxDistance::compareVecOfMaxsWithAllVecsInNode
          (KMaxDistance *this,MaxRec *newRec,MaxRec *nodeRec,MaxRec **recsToOverWrite,
          int *numToOverwrite)

{
  long in_RCX;
  MaxRec *in_RDX;
  MaxRec *in_RDI;
  int *in_R8;
  MaxRec *rec;
  int result;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  int local_4;
  
  iVar1 = 0;
  *in_R8 = 0;
  do {
    if (in_RDX == (MaxRec *)0x0) {
      if (*in_R8 < 1) {
        local_4 = 3;
      }
      else {
        local_4 = 2;
      }
      return local_4;
    }
    if (in_RDX->isUsed != 0) {
      iVar1 = compareTwoVecsOfMaxs
                        ((KMaxDistance *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),in_RDX,in_RDI);
      if (iVar1 < 2) {
        return iVar1;
      }
      if (iVar1 == 2) {
        *(MaxRec **)(in_RCX + (long)*in_R8 * 8) = in_RDX;
        *in_R8 = *in_R8 + 1;
        if (1999 < *in_R8) {
          printf("MAX_NUM_TO_OVERWRITE is too small\n");
          exit(1);
        }
      }
    }
    in_RDX = (MaxRec *)in_RDX->next;
  } while( true );
}

Assistant:

int KMaxDistance::compareVecOfMaxsWithAllVecsInNode( MaxRec *newRec, const MaxRec *nodeRec, MaxRec **recsToOverWrite, int *numToOverwrite ){

    int result = 0;
    *numToOverwrite = 0;
    MaxRec *rec = (MaxRec*)nodeRec;
    while ( rec != NULL ){
        if ( rec->isUsed ){
            result = compareTwoVecsOfMaxs( rec, newRec );
            if ( result <= 1 ) return result;
            if ( result == 2 ){
                recsToOverWrite[*numToOverwrite] = rec;
                (*numToOverwrite)++;
                if ( *numToOverwrite >= MAX_NUM_TO_OVERWRITE ){ printf( "MAX_NUM_TO_OVERWRITE is too small\n" ); exit(1); } 
            }
        }
        rec = (MaxRec*)rec->next;
    }
    //if ( *numToOverwrite > 1 ) printf( "numToOverwrite=%d\n", *numToOverwrite );
    if ( *numToOverwrite > 0 ) return 2;
    return 3;
}